

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hoardmanager.h
# Opt level: O0

void __thiscall
Hoard::
HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>
::HoardManager(HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>
               *this)

{
  size_t sVar1;
  BaseHoardManager<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>_>
  *in_RDI;
  Array<15UL,_Hoard::ManageOneSuperblock<Hoard::EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>_>_>
  *in_stack_fffffffffffffff0;
  
  BaseHoardManager<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>_>
  ::BaseHoardManager(in_RDI);
  in_RDI->_vptr_BaseHoardManager = (_func_int **)&PTR_free_001259f8;
  in_RDI[1]._vptr_BaseHoardManager = (_func_int **)0xfeeddadd;
  sVar1 = HL::
          bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144UL>::
          getClassSize(0);
  in_RDI[1]._magic = sVar1;
  in_RDI[2]._vptr_BaseHoardManager = (_func_int **)in_RDI[1]._magic;
  *(undefined4 *)&in_RDI[2]._magic = 0;
  HL::SpinLockType::SpinLockType((SpinLockType *)0x11b120);
  Array<15UL,_Hoard::Statistics>::Array((Array<15UL,_Hoard::Statistics> *)in_stack_fffffffffffffff0)
  ;
  Array<15UL,_Hoard::ManageOneSuperblock<Hoard::EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>_>_>
  ::Array(in_stack_fffffffffffffff0);
  GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::
  GlobalHeap((GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>
              *)in_RDI);
  AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>::AlignedSuperblockHeap
            ((AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource> *)0x11b167);
  return;
}

Assistant:

HoardManager()
      : _magic (MAGIC_NUMBER),
	_cachedSize (binType::getClassSize(0)),
	_cachedRealSize (_cachedSize),
	_cachedSizeClass (0)
    {}